

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_scan.c
# Opt level: O0

int IN_SCANSET(char *scanlist,char *end_scanlist,int rc)

{
  uint local_28;
  int previous;
  int rc_local;
  char *end_scanlist_local;
  char *scanlist_local;
  
  local_28 = 0xffffffff;
  end_scanlist_local = scanlist;
  do {
    if (end_scanlist_local == end_scanlist) {
      return 0;
    }
    if ((*end_scanlist_local == '-') && (local_28 != 0xffffffff)) {
      if (end_scanlist_local + 1 == end_scanlist) {
        return (uint)(rc == 0x2d);
      }
      while (local_28 = local_28 + 1, (int)local_28 <= (int)(uint)(byte)end_scanlist_local[1]) {
        if (local_28 == rc) {
          return 1;
        }
      }
      local_28 = 0xffffffff;
    }
    else {
      if (rc == (uint)(byte)*end_scanlist_local) {
        return 1;
      }
      local_28 = (uint)(byte)*end_scanlist_local;
    }
    end_scanlist_local = end_scanlist_local + 1;
  } while( true );
}

Assistant:

static int IN_SCANSET( const char * scanlist, const char * end_scanlist, int rc )
{
    /* SOLAR */
    int previous = -1;

    while ( scanlist != end_scanlist )
    {
        if ( ( *scanlist == '-' ) && ( previous != -1 ) )
        {
            /* possible scangroup ("a-z") */
            if ( ++scanlist == end_scanlist )
            {
                /* '-' at end of scanlist does not describe a scangroup */
                return rc == '-';
            }

            while ( ++previous <= ( unsigned char )*scanlist )
            {
                if ( previous == rc )
                {
                    return 1;
                }
            }

            previous = -1;
        }
        else
        {
            /* not a scangroup, check verbatim */
            if ( rc == ( unsigned char )*scanlist )
            {
                return 1;
            }

            previous = ( unsigned char )( *scanlist++ );
        }
    }

    return 0;
}